

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect_socket.cpp
# Opt level: O1

bool __thiscall cppnet::ConnectSocket::Listen(ConnectSocket *this)

{
  SysCallInt32Result SVar1;
  SingletonLogger *this_00;
  char *pcVar2;
  
  SVar1 = OsHandle::Listen((this->super_Socket)._sock,0);
  if (SVar1._return_value < 0) {
    this_00 = Singleton<cppnet::SingletonLogger>::Instance();
    pcVar2 = ErrnoInfo(SVar1._errno);
    SingletonLogger::Fatal
              (this_00,
               "/workspace/llm4binary/github/license_c_cmakelists/caozhiyi[P]CppNet/cppnet/socket/connect_socket.cpp"
               ,0x42,"listen socket filed! error:%d, info:%s",(ulong)SVar1 >> 0x20,pcVar2);
    OsHandle::Close((this->super_Socket)._sock);
  }
  else {
    SocketNoblocking((this->super_Socket)._sock);
    (*(this->super_Socket)._vptr_Socket[4])(this);
  }
  return -1 < SVar1._return_value;
}

Assistant:

bool ConnectSocket::Listen() {
    auto ret = OsHandle::Listen(_sock);
#ifndef __win__ // WEPOLL don't support reuse_port
    if (ret._return_value < 0 && __reuse_port) {
        LOG_FATAL("listen socket filed! error:%d, info:%s", ret._errno, ErrnoInfo(ret._errno));
        OsHandle::Close(_sock);
        return false;
    }
#endif

    //set the socket noblocking
    SocketNoblocking(_sock);

    Accept();

    return true;
}